

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::Processor::addSpecialisationParameter(Processor *this,UsingDeclaration *u)

{
  pool_ref<soul::AST::ASTObject> local_38 [3];
  pool_ref<soul::AST::UsingDeclaration> local_20;
  UsingDeclaration *local_18;
  UsingDeclaration *u_local;
  Processor *this_local;
  
  local_18 = u;
  u_local = (UsingDeclaration *)this;
  pool_ref<soul::AST::UsingDeclaration>::pool_ref<soul::AST::UsingDeclaration,void>(&local_20,u);
  std::
  vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
  ::push_back(&(this->super_ProcessorBase).super_ModuleBase.usings,&local_20);
  pool_ref<soul::AST::UsingDeclaration>::~pool_ref(&local_20);
  pool_ref<soul::AST::ASTObject>::pool_ref<soul::AST::UsingDeclaration,void>(local_38,local_18);
  std::
  vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
  ::push_back(&(this->super_ProcessorBase).super_ModuleBase.specialisationParams,local_38);
  pool_ref<soul::AST::ASTObject>::~pool_ref(local_38);
  return;
}

Assistant:

void addSpecialisationParameter (UsingDeclaration& u) override
        {
            usings.push_back (u);
            specialisationParams.push_back (u);
        }